

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restraint.hpp
# Opt level: O1

void __thiscall OpenMD::Restraint::~Restraint(Restraint *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Restraint = (_func_int **)&PTR__Restraint_002ac830;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  ::~_Rb_tree(&(this->restInfo_)._M_t);
  pcVar1 = (this->restName_)._M_dataplus._M_p;
  paVar2 = &(this->restName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Restraint() {}